

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_substring.c
# Opt level: O3

int coda_pcre2_substring_list_get_8
              (pcre2_match_data_8 *match_data,PCRE2_UCHAR8 ***listptr,size_t **lengthsptr)

{
  ushort uVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  void *pvVar5;
  ulong uVar6;
  PCRE2_UCHAR8 **ppPVar7;
  long lVar8;
  size_t size;
  size_t *psVar9;
  ulong uVar10;
  size_t __n;
  size_t *psVar11;
  undefined1 *puVar12;
  size_t *__dest;
  ulong local_48;
  
  iVar3 = match_data->rc;
  uVar4 = (ulong)iVar3;
  if ((long)uVar4 < 0) {
    return iVar3;
  }
  if (iVar3 == 0) {
    uVar1 = match_data->oveccount;
    uVar4 = (ulong)uVar1;
    uVar10 = (ulong)((uint)uVar1 * 8);
    size = 0x20;
    if (lengthsptr != (size_t **)0x0) {
      size = uVar10 + 0x20;
    }
    if (uVar1 == 0) {
      local_48 = 0;
      lVar8 = 8;
      bVar2 = true;
      goto LAB_0014c811;
    }
  }
  else {
    uVar10 = uVar4 * 8;
    size = 0x20;
    if (lengthsptr != (size_t **)0x0) {
      size = uVar4 * 8 + 0x20;
    }
  }
  local_48 = (ulong)(uint)((int)uVar4 * 2);
  uVar6 = 0;
  do {
    lVar8 = 0;
    if (match_data->ovector[uVar6] <= match_data->ovector[uVar6 + 1]) {
      lVar8 = match_data->ovector[uVar6 + 1] - match_data->ovector[uVar6];
    }
    size = size + lVar8 + 9;
    uVar6 = uVar6 + 2;
  } while (uVar6 < local_48);
  lVar8 = (uVar4 & 0xffffffff) * 8 + 8;
  bVar2 = false;
LAB_0014c811:
  pvVar5 = coda__pcre2_memctl_malloc_8(size,&match_data->memctl);
  if (pvVar5 == (void *)0x0) {
    iVar3 = -0x30;
  }
  else {
    ppPVar7 = (PCRE2_UCHAR8 **)((long)pvVar5 + 0x18);
    *listptr = ppPVar7;
    psVar11 = (size_t *)((long)pvVar5 + lVar8 + 0x18);
    if (lengthsptr == (size_t **)0x0) {
      psVar9 = (size_t *)0x0;
      __dest = psVar11;
    }
    else {
      *lengthsptr = psVar11;
      __dest = (size_t *)(uVar10 + (long)psVar11);
      psVar9 = psVar11;
    }
    if (!bVar2) {
      lVar8 = 0;
      uVar4 = 0;
      do {
        uVar10 = match_data->ovector[uVar4];
        uVar6 = match_data->ovector[uVar4 + 1];
        __n = 0;
        if (uVar10 <= uVar6) {
          __n = uVar6 - uVar10;
        }
        if (uVar10 <= uVar6 && uVar6 - uVar10 != 0) {
          memcpy(__dest,match_data->subject + uVar10,__n);
        }
        *(size_t **)((long)ppPVar7 + uVar4 * 4) = __dest;
        if (psVar9 == (size_t *)0x0) {
          psVar9 = (size_t *)0x0;
        }
        else {
          *psVar9 = __n;
          psVar9 = psVar9 + 1;
        }
        puVar12 = (undefined1 *)((long)__dest + __n);
        __dest = (size_t *)(puVar12 + 1);
        *puVar12 = 0;
        uVar4 = uVar4 + 2;
        lVar8 = lVar8 + 8;
      } while (uVar4 < local_48);
      ppPVar7 = (PCRE2_UCHAR8 **)((long)ppPVar7 + lVar8);
    }
    *ppPVar7 = (PCRE2_UCHAR8 *)0x0;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

PCRE2_CALL_CONVENTION
pcre2_substring_list_get(pcre2_match_data *match_data, PCRE2_UCHAR ***listptr,
  PCRE2_SIZE **lengthsptr)
{
int i, count, count2;
PCRE2_SIZE size;
PCRE2_SIZE *lensp;
pcre2_memctl *memp;
PCRE2_UCHAR **listp;
PCRE2_UCHAR *sp;
PCRE2_SIZE *ovector;

if ((count = match_data->rc) < 0) return count;   /* Match failed */
if (count == 0) count = match_data->oveccount;    /* Ovector too small */

count2 = 2*count;
ovector = match_data->ovector;
size = sizeof(pcre2_memctl) + sizeof(PCRE2_UCHAR *);      /* For final NULL */
if (lengthsptr != NULL) size += sizeof(PCRE2_SIZE) * count;  /* For lengths */

for (i = 0; i < count2; i += 2)
  {
  size += sizeof(PCRE2_UCHAR *) + CU2BYTES(1);
  if (ovector[i+1] > ovector[i]) size += CU2BYTES(ovector[i+1] - ovector[i]);
  }

memp = PRIV(memctl_malloc)(size, (pcre2_memctl *)match_data);
if (memp == NULL) return PCRE2_ERROR_NOMEMORY;

*listptr = listp = (PCRE2_UCHAR **)((char *)memp + sizeof(pcre2_memctl));
lensp = (PCRE2_SIZE *)((char *)listp + sizeof(PCRE2_UCHAR *) * (count + 1));

if (lengthsptr == NULL)
  {
  sp = (PCRE2_UCHAR *)lensp;
  lensp = NULL;
  }
else
  {
  *lengthsptr = lensp;
  sp = (PCRE2_UCHAR *)((char *)lensp + sizeof(PCRE2_SIZE) * count);
  }

for (i = 0; i < count2; i += 2)
  {
  size = (ovector[i+1] > ovector[i])? (ovector[i+1] - ovector[i]) : 0;

  /* Size == 0 includes the case when the capture is unset. Avoid adding
  PCRE2_UNSET to match_data->subject because it overflows, even though with
  zero size calling memcpy() is harmless. */

  if (size != 0) memcpy(sp, match_data->subject + ovector[i], CU2BYTES(size));
  *listp++ = sp;
  if (lensp != NULL) *lensp++ = size;
  sp += size;
  *sp++ = 0;
  }

*listp = NULL;
return 0;
}